

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int unixCheckReservedLock(sqlite3_file *id,int *pResOut)

{
  int iVar1;
  int *piVar2;
  sqlite3_io_methods *psVar3;
  int iVar4;
  uint uVar5;
  flock lock;
  
  psVar3 = id[2].pMethods;
  if ((sqlite3_mutex *)psVar3->xRead != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)((sqlite3_mutex *)psVar3->xRead);
    psVar3 = id[2].pMethods;
  }
  if (*(byte *)&psVar3->xTruncate < 2) {
    uVar5 = 0;
    iVar4 = 0;
    if (*(char *)((long)&psVar3->xTruncate + 1) == '\0') {
      iVar1 = (*aSyscall[7].pCurrent)((ulong)*(uint *)&id[3].pMethods,5);
      if (iVar1 == 0) {
        iVar4 = 0;
      }
      else {
        piVar2 = __errno_location();
        *(int *)&id[4].pMethods = *piVar2;
        iVar4 = 0xe0a;
      }
      uVar5 = (uint)(iVar1 == 0);
      psVar3 = id[2].pMethods;
    }
  }
  else {
    iVar4 = 0;
    uVar5 = 1;
  }
  if ((sqlite3_mutex *)psVar3->xRead != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)((sqlite3_mutex *)psVar3->xRead);
  }
  *pResOut = uVar5;
  return iVar4;
}

Assistant:

static int unixCheckReservedLock(sqlite3_file *id, int *pResOut){
  int rc = SQLITE_OK;
  int reserved = 0;
  unixFile *pFile = (unixFile*)id;

  SimulateIOError( return SQLITE_IOERR_CHECKRESERVEDLOCK; );

  assert( pFile );
  assert( pFile->eFileLock<=SHARED_LOCK );
  sqlite3_mutex_enter(pFile->pInode->pLockMutex);

  /* Check if a thread in this process holds such a lock */
  if( pFile->pInode->eFileLock>SHARED_LOCK ){
    reserved = 1;
  }

  /* Otherwise see if some other process holds it.
  */
#ifndef __DJGPP__
  if( !reserved && !pFile->pInode->bProcessLock ){
    struct flock lock;
    lock.l_whence = SEEK_SET;
    lock.l_start = RESERVED_BYTE;
    lock.l_len = 1;
    lock.l_type = F_WRLCK;
    if( osFcntl(pFile->h, F_GETLK, &lock) ){
      rc = SQLITE_IOERR_CHECKRESERVEDLOCK;
      storeLastErrno(pFile, errno);
    } else if( lock.l_type!=F_UNLCK ){
      reserved = 1;
    }
  }
#endif
  
  sqlite3_mutex_leave(pFile->pInode->pLockMutex);
  OSTRACE(("TEST WR-LOCK %d %d %d (unix)\n", pFile->h, rc, reserved));

  *pResOut = reserved;
  return rc;
}